

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 (*pauVar19) [16];
  undefined4 uVar20;
  undefined1 (*pauVar21) [16];
  long lVar22;
  ulong uVar24;
  RTCRayQueryContext *pRVar25;
  uint uVar26;
  ulong uVar27;
  int *piVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  float fVar41;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar40;
  undefined1 auVar39 [64];
  float fVar42;
  float fVar52;
  float fVar53;
  undefined1 auVar43 [16];
  float fVar54;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  float fVar65;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar81;
  float fVar83;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar85;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar82;
  float fVar84;
  float fVar86;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar87;
  float fVar88;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar89 [16];
  float fVar96;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  float fVar115;
  undefined1 auVar116 [16];
  float fVar123;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar121;
  float fVar122;
  undefined1 auVar120 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar129 [64];
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [64];
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar139 [64];
  float fVar143;
  undefined1 auVar144 [16];
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar145 [64];
  float fVar149;
  float fVar150;
  undefined1 auVar151 [16];
  float fVar158;
  undefined1 auVar152 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar159;
  undefined1 auVar153 [64];
  float fVar160;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar161 [64];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1289;
  ulong local_1288;
  ulong local_1280;
  undefined8 local_1278;
  float fStack_1270;
  float fStack_126c;
  long local_1260;
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  RayHit *local_1230;
  RayQueryContext *local_1228;
  int local_121c;
  undefined1 local_1218 [16];
  undefined1 local_1208 [16];
  RTCFilterFunctionNArguments local_11f8;
  undefined1 local_11c8 [16];
  long local_11b8;
  Scene *local_11b0;
  undefined4 local_11a8;
  undefined4 local_11a4;
  undefined4 local_11a0;
  undefined4 local_119c;
  undefined4 local_1198;
  undefined4 local_1194;
  uint local_1190;
  uint local_118c;
  uint local_1188;
  undefined1 local_1178 [16];
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 *local_1118;
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar23;
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar21 = (undefined1 (*) [16])local_f68;
    auVar79 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar56 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar78._8_4_ = 0x7fffffff;
    auVar78._0_8_ = 0x7fffffff7fffffff;
    auVar78._12_4_ = 0x7fffffff;
    auVar78 = vandps_avx((undefined1  [16])aVar2,auVar78);
    auVar98._8_4_ = 0x219392ef;
    auVar98._0_8_ = 0x219392ef219392ef;
    auVar98._12_4_ = 0x219392ef;
    auVar78 = vcmpps_avx(auVar78,auVar98,1);
    auVar99._8_4_ = 0x3f800000;
    auVar99._0_8_ = 0x3f8000003f800000;
    auVar99._12_4_ = 0x3f800000;
    auVar98 = vdivps_avx(auVar99,(undefined1  [16])aVar2);
    auVar100._8_4_ = 0x5d5e0b6b;
    auVar100._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar100._12_4_ = 0x5d5e0b6b;
    auVar78 = vblendvps_avx(auVar98,auVar100,auVar78);
    uStack_f70 = 0;
    auVar89._0_4_ = auVar78._0_4_ * 0.99999964;
    auVar89._4_4_ = auVar78._4_4_ * 0.99999964;
    auVar89._8_4_ = auVar78._8_4_ * 0.99999964;
    auVar89._12_4_ = auVar78._12_4_ * 0.99999964;
    auVar66._0_4_ = auVar78._0_4_ * 1.0000004;
    auVar66._4_4_ = auVar78._4_4_ * 1.0000004;
    auVar66._8_4_ = auVar78._8_4_ * 1.0000004;
    auVar66._12_4_ = auVar78._12_4_ * 1.0000004;
    uVar20 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_1018._4_4_ = uVar20;
    local_1018._0_4_ = uVar20;
    local_1018._8_4_ = uVar20;
    local_1018._12_4_ = uVar20;
    auVar114 = ZEXT1664(local_1018);
    uVar20 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_1028._4_4_ = uVar20;
    local_1028._0_4_ = uVar20;
    local_1028._8_4_ = uVar20;
    local_1028._12_4_ = uVar20;
    auVar120 = ZEXT1664(local_1028);
    uVar20 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1038._4_4_ = uVar20;
    local_1038._0_4_ = uVar20;
    local_1038._8_4_ = uVar20;
    local_1038._12_4_ = uVar20;
    auVar127 = ZEXT1664(local_1038);
    local_1048 = vshufps_avx(auVar89,auVar89,0);
    auVar129 = ZEXT1664(local_1048);
    auVar78 = vmovshdup_avx(auVar89);
    local_1058 = vshufps_avx(auVar89,auVar89,0x55);
    auVar134 = ZEXT1664(local_1058);
    auVar98 = vshufpd_avx(auVar89,auVar89,1);
    local_1068 = vshufps_avx(auVar89,auVar89,0xaa);
    auVar139 = ZEXT1664(local_1068);
    local_1078 = vshufps_avx(auVar66,auVar66,0);
    auVar145 = ZEXT1664(local_1078);
    uVar23 = (ulong)(auVar89._0_4_ < 0.0) << 4;
    local_1088 = vshufps_avx(auVar66,auVar66,0x55);
    auVar153 = ZEXT1664(local_1088);
    local_1098 = vshufps_avx(auVar66,auVar66,0xaa);
    auVar161 = ZEXT1664(local_1098);
    uVar29 = (ulong)(auVar78._0_4_ < 0.0) << 4 | 0x20;
    uVar32 = (ulong)(auVar98._0_4_ < 0.0) << 4 | 0x40;
    uVar30 = uVar23 ^ 0x10;
    uVar31 = uVar29 ^ 0x10;
    local_1178 = vshufps_avx(auVar79,auVar79,0);
    auVar108 = ZEXT1664(local_1178);
    auVar78 = vshufps_avx(auVar56,auVar56,0);
    auVar39 = ZEXT1664(auVar78);
    local_1168 = mm_lookupmask_ps._240_8_;
    uStack_1160 = mm_lookupmask_ps._248_8_;
    local_1228 = context;
    local_1230 = ray;
    local_1280 = uVar23;
    local_1288 = uVar29;
LAB_011d78af:
    do {
      pauVar19 = pauVar21 + -1;
      pauVar21 = pauVar21 + -1;
      if (*(float *)(*pauVar19 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar27 = *(ulong *)*pauVar21;
        while ((uVar27 & 8) == 0) {
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x20 + uVar23),auVar114._0_16_);
          auVar79._0_4_ = auVar129._0_4_ * auVar78._0_4_;
          auVar79._4_4_ = auVar129._4_4_ * auVar78._4_4_;
          auVar79._8_4_ = auVar129._8_4_ * auVar78._8_4_;
          auVar79._12_4_ = auVar129._12_4_ * auVar78._12_4_;
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x20 + uVar29),auVar120._0_16_);
          auVar56._0_4_ = auVar134._0_4_ * auVar78._0_4_;
          auVar56._4_4_ = auVar134._4_4_ * auVar78._4_4_;
          auVar56._8_4_ = auVar134._8_4_ * auVar78._8_4_;
          auVar56._12_4_ = auVar134._12_4_ * auVar78._12_4_;
          auVar78 = vmaxps_avx(auVar79,auVar56);
          auVar98 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x20 + uVar32),auVar127._0_16_);
          auVar57._0_4_ = auVar139._0_4_ * auVar98._0_4_;
          auVar57._4_4_ = auVar139._4_4_ * auVar98._4_4_;
          auVar57._8_4_ = auVar139._8_4_ * auVar98._8_4_;
          auVar57._12_4_ = auVar139._12_4_ * auVar98._12_4_;
          auVar98 = vmaxps_avx(auVar57,auVar108._0_16_);
          local_1148 = vmaxps_avx(auVar78,auVar98);
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x20 + uVar30),auVar114._0_16_);
          auVar58._0_4_ = auVar145._0_4_ * auVar78._0_4_;
          auVar58._4_4_ = auVar145._4_4_ * auVar78._4_4_;
          auVar58._8_4_ = auVar145._8_4_ * auVar78._8_4_;
          auVar58._12_4_ = auVar145._12_4_ * auVar78._12_4_;
          auVar78 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x20 + uVar31),auVar120._0_16_);
          auVar67._0_4_ = auVar153._0_4_ * auVar78._0_4_;
          auVar67._4_4_ = auVar153._4_4_ * auVar78._4_4_;
          auVar67._8_4_ = auVar153._8_4_ * auVar78._8_4_;
          auVar67._12_4_ = auVar153._12_4_ * auVar78._12_4_;
          auVar78 = vminps_avx(auVar58,auVar67);
          auVar98 = vsubps_avx(*(undefined1 (*) [16])(uVar27 + 0x20 + (uVar32 ^ 0x10)),
                               auVar127._0_16_);
          auVar68._0_4_ = auVar161._0_4_ * auVar98._0_4_;
          auVar68._4_4_ = auVar161._4_4_ * auVar98._4_4_;
          auVar68._8_4_ = auVar161._8_4_ * auVar98._8_4_;
          auVar68._12_4_ = auVar161._12_4_ * auVar98._12_4_;
          auVar98 = vminps_avx(auVar68,auVar39._0_16_);
          auVar78 = vminps_avx(auVar78,auVar98);
          auVar78 = vcmpps_avx(local_1148,auVar78,2);
          uVar26 = vmovmskps_avx(auVar78);
          if (uVar26 == 0) {
            if (pauVar21 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_011d78af;
          }
          uVar26 = uVar26 & 0xff;
          uVar24 = uVar27 & 0xfffffffffffffff0;
          lVar22 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
            }
          }
          uVar27 = *(ulong *)(uVar24 + lVar22 * 8);
          uVar26 = uVar26 - 1 & uVar26;
          if (uVar26 != 0) {
            uVar4 = *(uint *)(local_1148 + lVar22 * 4);
            lVar22 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
              }
            }
            uVar5 = *(ulong *)(uVar24 + lVar22 * 8);
            uVar3 = *(uint *)(local_1148 + lVar22 * 4);
            uVar26 = uVar26 - 1 & uVar26;
            uVar23 = local_1280;
            uVar29 = local_1288;
            if (uVar26 == 0) {
              if (uVar4 < uVar3) {
                *(ulong *)*pauVar21 = uVar5;
                *(uint *)(*pauVar21 + 8) = uVar3;
                pauVar21 = pauVar21 + 1;
              }
              else {
                *(ulong *)*pauVar21 = uVar27;
                *(uint *)(*pauVar21 + 8) = uVar4;
                pauVar21 = pauVar21 + 1;
                uVar27 = uVar5;
              }
            }
            else {
              auVar43._8_8_ = 0;
              auVar43._0_8_ = uVar27;
              auVar78 = vpunpcklqdq_avx(auVar43,ZEXT416(uVar4));
              auVar59._8_8_ = 0;
              auVar59._0_8_ = uVar5;
              auVar98 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar3));
              lVar22 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                }
              }
              auVar69._8_8_ = 0;
              auVar69._0_8_ = *(ulong *)(uVar24 + lVar22 * 8);
              auVar56 = vpunpcklqdq_avx(auVar69,ZEXT416(*(uint *)(local_1148 + lVar22 * 4)));
              auVar79 = vpcmpgtd_avx(auVar98,auVar78);
              uVar26 = uVar26 - 1 & uVar26;
              if (uVar26 == 0) {
                auVar66 = vpshufd_avx(auVar79,0xaa);
                auVar79 = vblendvps_avx(auVar98,auVar78,auVar66);
                auVar78 = vblendvps_avx(auVar78,auVar98,auVar66);
                auVar98 = vpcmpgtd_avx(auVar56,auVar79);
                auVar66 = vpshufd_avx(auVar98,0xaa);
                auVar98 = vblendvps_avx(auVar56,auVar79,auVar66);
                auVar79 = vblendvps_avx(auVar79,auVar56,auVar66);
                auVar56 = vpcmpgtd_avx(auVar79,auVar78);
                auVar66 = vpshufd_avx(auVar56,0xaa);
                auVar56 = vblendvps_avx(auVar79,auVar78,auVar66);
                auVar78 = vblendvps_avx(auVar78,auVar79,auVar66);
                *pauVar21 = auVar78;
                pauVar21[1] = auVar56;
                uVar27 = auVar98._0_8_;
                pauVar21 = pauVar21 + 2;
              }
              else {
                lVar22 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
                  }
                }
                auVar101._8_8_ = 0;
                auVar101._0_8_ = *(ulong *)(uVar24 + lVar22 * 8);
                auVar89 = vpunpcklqdq_avx(auVar101,ZEXT416(*(uint *)(local_1148 + lVar22 * 4)));
                auVar66 = vpshufd_avx(auVar79,0xaa);
                auVar79 = vblendvps_avx(auVar98,auVar78,auVar66);
                auVar78 = vblendvps_avx(auVar78,auVar98,auVar66);
                auVar98 = vpcmpgtd_avx(auVar89,auVar56);
                auVar66 = vpshufd_avx(auVar98,0xaa);
                auVar98 = vblendvps_avx(auVar89,auVar56,auVar66);
                auVar56 = vblendvps_avx(auVar56,auVar89,auVar66);
                auVar66 = vpcmpgtd_avx(auVar56,auVar78);
                auVar89 = vpshufd_avx(auVar66,0xaa);
                auVar66 = vblendvps_avx(auVar56,auVar78,auVar89);
                auVar78 = vblendvps_avx(auVar78,auVar56,auVar89);
                auVar56 = vpcmpgtd_avx(auVar98,auVar79);
                auVar89 = vpshufd_avx(auVar56,0xaa);
                auVar56 = vblendvps_avx(auVar98,auVar79,auVar89);
                auVar98 = vblendvps_avx(auVar79,auVar98,auVar89);
                auVar79 = vpcmpgtd_avx(auVar66,auVar98);
                auVar89 = vpshufd_avx(auVar79,0xaa);
                auVar79 = vblendvps_avx(auVar66,auVar98,auVar89);
                auVar98 = vblendvps_avx(auVar98,auVar66,auVar89);
                *pauVar21 = auVar78;
                pauVar21[1] = auVar98;
                pauVar21[2] = auVar79;
                auVar108 = ZEXT1664(local_1178);
                uVar27 = auVar56._0_8_;
                pauVar21 = pauVar21 + 3;
              }
            }
          }
        }
        local_11b8 = (ulong)((uint)uVar27 & 0xf) - 8;
        if (local_11b8 != 0) {
          uVar27 = uVar27 & 0xfffffffffffffff0;
          local_1260 = 0;
          do {
            lVar22 = local_1260 * 0x50;
            local_11b0 = context->scene;
            ppfVar6 = (context->scene->vertices).items;
            pfVar7 = ppfVar6[*(uint *)(uVar27 + 0x30 + lVar22)];
            pfVar8 = ppfVar6[*(uint *)(uVar27 + 0x34 + lVar22)];
            pfVar9 = ppfVar6[*(uint *)(uVar27 + 0x38 + lVar22)];
            pfVar10 = ppfVar6[*(uint *)(uVar27 + 0x3c + lVar22)];
            auVar79 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar27 + lVar22)),
                                    *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar27 + 8 + lVar22)))
            ;
            auVar78 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar27 + lVar22)),
                                    *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar27 + 8 + lVar22)))
            ;
            auVar56 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar27 + 4 + lVar22)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar27 + 0xc + lVar22)));
            auVar98 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar27 + 4 + lVar22)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar27 + 0xc + lVar22)));
            auVar89 = vunpcklps_avx(auVar78,auVar98);
            auVar99 = vunpcklps_avx(auVar79,auVar56);
            auVar78 = vunpckhps_avx(auVar79,auVar56);
            auVar56 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar27 + 0x10 + lVar22)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar27 + 0x18 + lVar22)));
            auVar98 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar27 + 0x10 + lVar22)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar27 + 0x18 + lVar22)));
            auVar66 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0x14 + lVar22)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar27 + 0x1c + lVar22)));
            auVar79 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0x14 + lVar22)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar27 + 0x1c + lVar22)));
            auVar100 = vunpcklps_avx(auVar98,auVar79);
            auVar57 = vunpcklps_avx(auVar56,auVar66);
            auVar98 = vunpckhps_avx(auVar56,auVar66);
            auVar66 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar27 + 0x20 + lVar22)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar27 + 0x28 + lVar22)));
            auVar79 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar27 + 0x20 + lVar22)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar27 + 0x28 + lVar22)));
            auVar58 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0x24 + lVar22)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar27 + 0x2c + lVar22)));
            auVar56 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0x24 + lVar22)),
                                    *(undefined1 (*) [16])
                                     (pfVar10 + *(uint *)(uVar27 + 0x2c + lVar22)));
            auVar67 = vunpcklps_avx(auVar79,auVar56);
            auVar56 = vunpcklps_avx(auVar66,auVar58);
            auVar66 = vunpckhps_avx(auVar66,auVar58);
            puVar1 = (undefined8 *)(uVar27 + 0x30 + lVar22);
            local_f88 = *puVar1;
            uStack_f80 = puVar1[1];
            puVar1 = (undefined8 *)(uVar27 + 0x40 + lVar22);
            local_1158 = *puVar1;
            uStack_1150 = puVar1[1];
            uVar20 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar124._4_4_ = uVar20;
            auVar124._0_4_ = uVar20;
            auVar124._8_4_ = uVar20;
            auVar124._12_4_ = uVar20;
            uVar20 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar144._4_4_ = uVar20;
            auVar144._0_4_ = uVar20;
            auVar144._8_4_ = uVar20;
            auVar144._12_4_ = uVar20;
            uVar20 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar151._4_4_ = uVar20;
            auVar151._0_4_ = uVar20;
            auVar151._8_4_ = uVar20;
            auVar151._12_4_ = uVar20;
            local_1208 = vsubps_avx(auVar99,auVar124);
            local_11c8 = vsubps_avx(auVar78,auVar144);
            local_f98 = vsubps_avx(auVar89,auVar151);
            auVar78 = vsubps_avx(auVar57,auVar124);
            auVar98 = vsubps_avx(auVar98,auVar144);
            auVar79 = vsubps_avx(auVar100,auVar151);
            auVar56 = vsubps_avx(auVar56,auVar124);
            auVar66 = vsubps_avx(auVar66,auVar144);
            auVar89 = vsubps_avx(auVar67,auVar151);
            local_fa8 = vsubps_avx(auVar56,local_1208);
            local_fb8 = vsubps_avx(auVar66,local_11c8);
            local_fc8 = vsubps_avx(auVar89,local_f98);
            fVar12 = local_11c8._0_4_;
            fVar42 = auVar66._0_4_ + fVar12;
            fVar82 = local_11c8._4_4_;
            fVar52 = auVar66._4_4_ + fVar82;
            fVar86 = local_11c8._8_4_;
            fVar53 = auVar66._8_4_ + fVar86;
            fVar15 = local_11c8._12_4_;
            fVar54 = auVar66._12_4_ + fVar15;
            fVar128 = local_f98._0_4_;
            fVar87 = fVar128 + auVar89._0_4_;
            fVar130 = local_f98._4_4_;
            fVar92 = fVar130 + auVar89._4_4_;
            fVar131 = local_f98._8_4_;
            fVar94 = fVar131 + auVar89._8_4_;
            fVar132 = local_f98._12_4_;
            fVar96 = fVar132 + auVar89._12_4_;
            fVar55 = local_fc8._0_4_;
            auVar116._0_4_ = fVar55 * fVar42;
            fVar65 = local_fc8._4_4_;
            auVar116._4_4_ = fVar65 * fVar52;
            fVar40 = local_fc8._8_4_;
            auVar116._8_4_ = fVar40 * fVar53;
            fVar41 = local_fc8._12_4_;
            auVar116._12_4_ = fVar41 * fVar54;
            fVar160 = local_fb8._0_4_;
            auVar125._0_4_ = fVar160 * fVar87;
            fVar162 = local_fb8._4_4_;
            auVar125._4_4_ = fVar162 * fVar92;
            fVar163 = local_fb8._8_4_;
            auVar125._8_4_ = fVar163 * fVar94;
            fVar164 = local_fb8._12_4_;
            auVar125._12_4_ = fVar164 * fVar96;
            auVar99 = vsubps_avx(auVar125,auVar116);
            fVar13 = local_1208._0_4_;
            fVar115 = auVar56._0_4_ + fVar13;
            fVar84 = local_1208._4_4_;
            fVar121 = auVar56._4_4_ + fVar84;
            fVar14 = local_1208._8_4_;
            fVar122 = auVar56._8_4_ + fVar14;
            fVar16 = local_1208._12_4_;
            fVar123 = auVar56._12_4_ + fVar16;
            fVar149 = local_fa8._0_4_;
            auVar90._0_4_ = fVar149 * fVar87;
            fVar154 = local_fa8._4_4_;
            auVar90._4_4_ = fVar154 * fVar92;
            fVar156 = local_fa8._8_4_;
            auVar90._8_4_ = fVar156 * fVar94;
            fVar158 = local_fa8._12_4_;
            auVar90._12_4_ = fVar158 * fVar96;
            auVar126._0_4_ = fVar115 * fVar55;
            auVar126._4_4_ = fVar121 * fVar65;
            auVar126._8_4_ = fVar122 * fVar40;
            auVar126._12_4_ = fVar123 * fVar41;
            auVar100 = vsubps_avx(auVar126,auVar90);
            auVar117._0_4_ = fVar160 * fVar115;
            auVar117._4_4_ = fVar162 * fVar121;
            auVar117._8_4_ = fVar163 * fVar122;
            auVar117._12_4_ = fVar164 * fVar123;
            auVar33._0_4_ = fVar149 * fVar42;
            auVar33._4_4_ = fVar154 * fVar52;
            auVar33._8_4_ = fVar156 * fVar53;
            auVar33._12_4_ = fVar158 * fVar54;
            auVar57 = vsubps_avx(auVar33,auVar117);
            local_1278._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar42 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar52 = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_fe8._0_4_ =
                 auVar99._0_4_ * fVar52 + fVar42 * auVar100._0_4_ + local_1278._4_4_ * auVar57._0_4_
            ;
            local_fe8._4_4_ =
                 auVar99._4_4_ * fVar52 + fVar42 * auVar100._4_4_ + local_1278._4_4_ * auVar57._4_4_
            ;
            local_fe8._8_4_ =
                 auVar99._8_4_ * fVar52 + fVar42 * auVar100._8_4_ + local_1278._4_4_ * auVar57._8_4_
            ;
            local_fe8._12_4_ =
                 auVar99._12_4_ * fVar52 +
                 fVar42 * auVar100._12_4_ + local_1278._4_4_ * auVar57._12_4_;
            local_fd8 = vsubps_avx(local_11c8,auVar98);
            auVar99 = vsubps_avx(local_f98,auVar79);
            fVar53 = fVar12 + auVar98._0_4_;
            fVar54 = fVar82 + auVar98._4_4_;
            fVar87 = fVar86 + auVar98._8_4_;
            fVar92 = fVar15 + auVar98._12_4_;
            fVar94 = fVar128 + auVar79._0_4_;
            fVar96 = fVar130 + auVar79._4_4_;
            fVar115 = fVar131 + auVar79._8_4_;
            fVar121 = fVar132 + auVar79._12_4_;
            fVar133 = auVar99._0_4_;
            auVar152._0_4_ = fVar133 * fVar53;
            fVar135 = auVar99._4_4_;
            auVar152._4_4_ = fVar135 * fVar54;
            fVar136 = auVar99._8_4_;
            auVar152._8_4_ = fVar136 * fVar87;
            fVar137 = auVar99._12_4_;
            auVar152._12_4_ = fVar137 * fVar92;
            fVar143 = local_fd8._0_4_;
            auVar70._0_4_ = fVar143 * fVar94;
            fVar146 = local_fd8._4_4_;
            auVar70._4_4_ = fVar146 * fVar96;
            fVar147 = local_fd8._8_4_;
            auVar70._8_4_ = fVar147 * fVar115;
            fVar148 = local_fd8._12_4_;
            auVar70._12_4_ = fVar148 * fVar121;
            auVar99 = vsubps_avx(auVar70,auVar152);
            auVar100 = vsubps_avx(local_1208,auVar78);
            fVar150 = auVar100._0_4_;
            auVar91._0_4_ = fVar150 * fVar94;
            fVar155 = auVar100._4_4_;
            auVar91._4_4_ = fVar155 * fVar96;
            fVar157 = auVar100._8_4_;
            auVar91._8_4_ = fVar157 * fVar115;
            fVar159 = auVar100._12_4_;
            auVar91._12_4_ = fVar159 * fVar121;
            fVar94 = fVar13 + auVar78._0_4_;
            fVar96 = fVar84 + auVar78._4_4_;
            fVar115 = fVar14 + auVar78._8_4_;
            fVar121 = fVar16 + auVar78._12_4_;
            auVar118._0_4_ = fVar133 * fVar94;
            auVar118._4_4_ = fVar135 * fVar96;
            auVar118._8_4_ = fVar136 * fVar115;
            auVar118._12_4_ = fVar137 * fVar121;
            auVar100 = vsubps_avx(auVar118,auVar91);
            auVar109._0_4_ = fVar143 * fVar94;
            auVar109._4_4_ = fVar146 * fVar96;
            auVar109._8_4_ = fVar147 * fVar115;
            auVar109._12_4_ = fVar148 * fVar121;
            auVar34._0_4_ = fVar150 * fVar53;
            auVar34._4_4_ = fVar155 * fVar54;
            auVar34._8_4_ = fVar157 * fVar87;
            auVar34._12_4_ = fVar159 * fVar92;
            auVar57 = vsubps_avx(auVar34,auVar109);
            local_1138._0_4_ =
                 fVar52 * auVar99._0_4_ + fVar42 * auVar100._0_4_ + local_1278._4_4_ * auVar57._0_4_
            ;
            local_1138._4_4_ =
                 fVar52 * auVar99._4_4_ + fVar42 * auVar100._4_4_ + local_1278._4_4_ * auVar57._4_4_
            ;
            local_1138._8_4_ =
                 fVar52 * auVar99._8_4_ + fVar42 * auVar100._8_4_ + local_1278._4_4_ * auVar57._8_4_
            ;
            local_1138._12_4_ =
                 fVar52 * auVar99._12_4_ +
                 fVar42 * auVar100._12_4_ + local_1278._4_4_ * auVar57._12_4_;
            auVar99 = vsubps_avx(auVar78,auVar56);
            fVar123 = auVar56._0_4_ + auVar78._0_4_;
            fVar81 = auVar56._4_4_ + auVar78._4_4_;
            fVar83 = auVar56._8_4_ + auVar78._8_4_;
            fVar85 = auVar56._12_4_ + auVar78._12_4_;
            auVar78 = vsubps_avx(auVar98,auVar66);
            fVar96 = auVar98._0_4_ + auVar66._0_4_;
            fVar115 = auVar98._4_4_ + auVar66._4_4_;
            fVar121 = auVar98._8_4_ + auVar66._8_4_;
            fVar122 = auVar98._12_4_ + auVar66._12_4_;
            auVar98 = vsubps_avx(auVar79,auVar89);
            fVar54 = auVar79._0_4_ + auVar89._0_4_;
            fVar87 = auVar79._4_4_ + auVar89._4_4_;
            fVar92 = auVar79._8_4_ + auVar89._8_4_;
            fVar94 = auVar79._12_4_ + auVar89._12_4_;
            fVar88 = auVar98._0_4_;
            auVar102._0_4_ = fVar88 * fVar96;
            fVar93 = auVar98._4_4_;
            auVar102._4_4_ = fVar93 * fVar115;
            fVar95 = auVar98._8_4_;
            auVar102._8_4_ = fVar95 * fVar121;
            fVar97 = auVar98._12_4_;
            auVar102._12_4_ = fVar97 * fVar122;
            fVar138 = auVar78._0_4_;
            auVar110._0_4_ = fVar138 * fVar54;
            fVar140 = auVar78._4_4_;
            auVar110._4_4_ = fVar140 * fVar87;
            fVar141 = auVar78._8_4_;
            auVar110._8_4_ = fVar141 * fVar92;
            fVar142 = auVar78._12_4_;
            auVar110._12_4_ = fVar142 * fVar94;
            auVar78 = vsubps_avx(auVar110,auVar102);
            fVar53 = auVar99._0_4_;
            auVar44._0_4_ = fVar53 * fVar54;
            fVar54 = auVar99._4_4_;
            auVar44._4_4_ = fVar54 * fVar87;
            fVar87 = auVar99._8_4_;
            auVar44._8_4_ = fVar87 * fVar92;
            fVar92 = auVar99._12_4_;
            auVar44._12_4_ = fVar92 * fVar94;
            auVar111._0_4_ = fVar88 * fVar123;
            auVar111._4_4_ = fVar93 * fVar81;
            auVar111._8_4_ = fVar95 * fVar83;
            auVar111._12_4_ = fVar97 * fVar85;
            auVar98 = vsubps_avx(auVar111,auVar44);
            auVar71._0_4_ = fVar138 * fVar123;
            auVar71._4_4_ = fVar140 * fVar81;
            auVar71._8_4_ = fVar141 * fVar83;
            auVar71._12_4_ = fVar142 * fVar85;
            auVar60._0_4_ = fVar53 * fVar96;
            auVar60._4_4_ = fVar54 * fVar115;
            auVar60._8_4_ = fVar87 * fVar121;
            auVar60._12_4_ = fVar92 * fVar122;
            auVar79 = vsubps_avx(auVar60,auVar71);
            local_1278._0_4_ = (uint)local_1278._4_4_;
            fStack_1270 = local_1278._4_4_;
            fStack_126c = local_1278._4_4_;
            auVar45._0_4_ =
                 fVar52 * auVar78._0_4_ + fVar42 * auVar98._0_4_ + local_1278._4_4_ * auVar79._0_4_;
            auVar45._4_4_ =
                 fVar52 * auVar78._4_4_ + fVar42 * auVar98._4_4_ + local_1278._4_4_ * auVar79._4_4_;
            auVar45._8_4_ =
                 fVar52 * auVar78._8_4_ + fVar42 * auVar98._8_4_ + local_1278._4_4_ * auVar79._8_4_;
            auVar45._12_4_ =
                 fVar52 * auVar78._12_4_ +
                 fVar42 * auVar98._12_4_ + local_1278._4_4_ * auVar79._12_4_;
            local_1128._0_4_ = auVar45._0_4_ + local_fe8._0_4_ + local_1138._0_4_;
            local_1128._4_4_ = auVar45._4_4_ + local_fe8._4_4_ + local_1138._4_4_;
            local_1128._8_4_ = auVar45._8_4_ + local_fe8._8_4_ + local_1138._8_4_;
            local_1128._12_4_ = auVar45._12_4_ + local_fe8._12_4_ + local_1138._12_4_;
            auVar78 = vminps_avx(local_fe8,local_1138);
            auVar78 = vminps_avx(auVar78,auVar45);
            auVar72._8_4_ = 0x7fffffff;
            auVar72._0_8_ = 0x7fffffff7fffffff;
            auVar72._12_4_ = 0x7fffffff;
            local_ff8 = vandps_avx(local_1128,auVar72);
            auVar73._0_4_ = local_ff8._0_4_ * 1.1920929e-07;
            auVar73._4_4_ = local_ff8._4_4_ * 1.1920929e-07;
            auVar73._8_4_ = local_ff8._8_4_ * 1.1920929e-07;
            auVar73._12_4_ = local_ff8._12_4_ * 1.1920929e-07;
            uVar23 = CONCAT44(auVar73._4_4_,auVar73._0_4_);
            auVar103._0_8_ = uVar23 ^ 0x8000000080000000;
            auVar103._8_4_ = -auVar73._8_4_;
            auVar103._12_4_ = -auVar73._12_4_;
            auVar78 = vcmpps_avx(auVar78,auVar103,5);
            auVar98 = vmaxps_avx(local_fe8,local_1138);
            auVar98 = vmaxps_avx(auVar98,auVar45);
            auVar98 = vcmpps_avx(auVar98,auVar73,2);
            local_1008 = vorps_avx(auVar78,auVar98);
            local_1289 = 0;
            auVar17._8_8_ = uStack_1160;
            auVar17._0_8_ = local_1168;
            auVar17 = auVar17 & local_1008;
            if ((((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar17[0xf] < '\0') {
              auVar46._0_4_ = fVar55 * fVar143;
              auVar46._4_4_ = fVar65 * fVar146;
              auVar46._8_4_ = fVar40 * fVar147;
              auVar46._12_4_ = fVar41 * fVar148;
              auVar61._0_4_ = fVar160 * fVar133;
              auVar61._4_4_ = fVar162 * fVar135;
              auVar61._8_4_ = fVar163 * fVar136;
              auVar61._12_4_ = fVar164 * fVar137;
              auVar79 = vsubps_avx(auVar61,auVar46);
              auVar74._0_4_ = fVar133 * fVar138;
              auVar74._4_4_ = fVar135 * fVar140;
              auVar74._8_4_ = fVar136 * fVar141;
              auVar74._12_4_ = fVar137 * fVar142;
              auVar104._0_4_ = fVar143 * fVar88;
              auVar104._4_4_ = fVar146 * fVar93;
              auVar104._8_4_ = fVar147 * fVar95;
              auVar104._12_4_ = fVar148 * fVar97;
              auVar56 = vsubps_avx(auVar104,auVar74);
              auVar112._8_4_ = 0x7fffffff;
              auVar112._0_8_ = 0x7fffffff7fffffff;
              auVar112._12_4_ = 0x7fffffff;
              auVar78 = vandps_avx(auVar46,auVar112);
              auVar98 = vandps_avx(auVar74,auVar112);
              auVar78 = vcmpps_avx(auVar78,auVar98,1);
              local_10c8 = vblendvps_avx(auVar56,auVar79,auVar78);
              auVar47._0_4_ = fVar150 * fVar88;
              auVar47._4_4_ = fVar155 * fVar93;
              auVar47._8_4_ = fVar157 * fVar95;
              auVar47._12_4_ = fVar159 * fVar97;
              auVar62._0_4_ = fVar55 * fVar150;
              auVar62._4_4_ = fVar65 * fVar155;
              auVar62._8_4_ = fVar40 * fVar157;
              auVar62._12_4_ = fVar41 * fVar159;
              auVar75._0_4_ = fVar149 * fVar133;
              auVar75._4_4_ = fVar154 * fVar135;
              auVar75._8_4_ = fVar156 * fVar136;
              auVar75._12_4_ = fVar158 * fVar137;
              auVar79 = vsubps_avx(auVar62,auVar75);
              auVar105._0_4_ = fVar133 * fVar53;
              auVar105._4_4_ = fVar135 * fVar54;
              auVar105._8_4_ = fVar136 * fVar87;
              auVar105._12_4_ = fVar137 * fVar92;
              auVar56 = vsubps_avx(auVar105,auVar47);
              auVar78 = vandps_avx(auVar75,auVar112);
              auVar98 = vandps_avx(auVar47,auVar112);
              auVar78 = vcmpps_avx(auVar78,auVar98,1);
              local_10b8 = vblendvps_avx(auVar56,auVar79,auVar78);
              auVar35._0_4_ = fVar143 * fVar53;
              auVar35._4_4_ = fVar146 * fVar54;
              auVar35._8_4_ = fVar147 * fVar87;
              auVar35._12_4_ = fVar148 * fVar92;
              auVar63._0_4_ = fVar149 * fVar143;
              auVar63._4_4_ = fVar154 * fVar146;
              auVar63._8_4_ = fVar156 * fVar147;
              auVar63._12_4_ = fVar158 * fVar148;
              auVar76._0_4_ = fVar160 * fVar150;
              auVar76._4_4_ = fVar162 * fVar155;
              auVar76._8_4_ = fVar163 * fVar157;
              auVar76._12_4_ = fVar164 * fVar159;
              auVar106._0_4_ = fVar150 * fVar138;
              auVar106._4_4_ = fVar155 * fVar140;
              auVar106._8_4_ = fVar157 * fVar141;
              auVar106._12_4_ = fVar159 * fVar142;
              auVar79 = vsubps_avx(auVar63,auVar76);
              auVar56 = vsubps_avx(auVar106,auVar35);
              auVar78 = vandps_avx(auVar76,auVar112);
              auVar98 = vandps_avx(auVar35,auVar112);
              auVar78 = vcmpps_avx(auVar78,auVar98,1);
              local_10a8 = vblendvps_avx(auVar56,auVar79,auVar78);
              fVar55 = local_10c8._0_4_ * fVar52 +
                       local_10b8._0_4_ * fVar42 + local_10a8._0_4_ * local_1278._4_4_;
              fVar53 = local_10c8._4_4_ * fVar52 +
                       local_10b8._4_4_ * fVar42 + local_10a8._4_4_ * local_1278._4_4_;
              fVar65 = local_10c8._8_4_ * fVar52 +
                       local_10b8._8_4_ * fVar42 + local_10a8._8_4_ * local_1278._4_4_;
              fVar42 = local_10c8._12_4_ * fVar52 +
                       local_10b8._12_4_ * fVar42 + local_10a8._12_4_ * local_1278._4_4_;
              auVar64._0_4_ = fVar55 + fVar55;
              auVar64._4_4_ = fVar53 + fVar53;
              auVar64._8_4_ = fVar65 + fVar65;
              auVar64._12_4_ = fVar42 + fVar42;
              fVar55 = local_10c8._0_4_ * fVar13 +
                       local_10b8._0_4_ * fVar12 + local_10a8._0_4_ * fVar128;
              fVar82 = local_10c8._4_4_ * fVar84 +
                       local_10b8._4_4_ * fVar82 + local_10a8._4_4_ * fVar130;
              fVar84 = local_10c8._8_4_ * fVar14 +
                       local_10b8._8_4_ * fVar86 + local_10a8._8_4_ * fVar131;
              fVar86 = local_10c8._12_4_ * fVar16 +
                       local_10b8._12_4_ * fVar15 + local_10a8._12_4_ * fVar132;
              auVar78 = vrcpps_avx(auVar64);
              fVar42 = auVar78._0_4_;
              auVar113._0_4_ = auVar64._0_4_ * fVar42;
              fVar52 = auVar78._4_4_;
              auVar113._4_4_ = auVar64._4_4_ * fVar52;
              fVar12 = auVar78._8_4_;
              auVar113._8_4_ = auVar64._8_4_ * fVar12;
              fVar13 = auVar78._12_4_;
              auVar113._12_4_ = auVar64._12_4_ * fVar13;
              auVar119._8_4_ = 0x3f800000;
              auVar119._0_8_ = 0x3f8000003f800000;
              auVar119._12_4_ = 0x3f800000;
              auVar78 = vsubps_avx(auVar119,auVar113);
              local_1248._0_4_ = (fVar55 + fVar55) * (fVar42 + fVar42 * auVar78._0_4_);
              local_1248._4_4_ = (fVar82 + fVar82) * (fVar52 + fVar52 * auVar78._4_4_);
              local_1248._8_4_ = (fVar84 + fVar84) * (fVar12 + fVar12 * auVar78._8_4_);
              local_1248._12_4_ = (fVar86 + fVar86) * (fVar13 + fVar13 * auVar78._12_4_);
              uVar20 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar77._4_4_ = uVar20;
              auVar77._0_4_ = uVar20;
              auVar77._8_4_ = uVar20;
              auVar77._12_4_ = uVar20;
              auVar78 = vcmpps_avx(auVar77,local_1248,2);
              fVar42 = (ray->super_RayK<1>).tfar;
              auVar107._4_4_ = fVar42;
              auVar107._0_4_ = fVar42;
              auVar107._8_4_ = fVar42;
              auVar107._12_4_ = fVar42;
              auVar98 = vcmpps_avx(local_1248,auVar107,2);
              auVar78 = vandps_avx(auVar78,auVar98);
              auVar98 = vcmpps_avx(auVar64,_DAT_01f7aa10,4);
              auVar78 = vandps_avx(auVar98,auVar78);
              auVar18._8_8_ = uStack_1160;
              auVar18._0_8_ = local_1168;
              auVar98 = vandps_avx(local_1008,auVar18);
              auVar78 = vpslld_avx(auVar78,0x1f);
              auVar79 = vpsrad_avx(auVar78,0x1f);
              auVar78 = auVar98 & auVar79;
              if ((((auVar78 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar78 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar78[0xf] < '\0') {
                local_1258._0_4_ = (ray->super_RayK<1>).tfar;
                local_1258._4_4_ = (ray->super_RayK<1>).mask;
                local_1258._8_4_ = (ray->super_RayK<1>).id;
                local_1258._12_4_ = (ray->super_RayK<1>).flags;
                auVar98 = vandps_avx(auVar79,auVar98);
                local_1148 = local_fe8;
                local_1118 = &local_1289;
                local_1108 = auVar98;
                local_10d8 = local_1248;
                local_1218 = auVar98;
                auVar78 = vrcpps_avx(local_1128);
                fVar42 = auVar78._0_4_;
                auVar48._0_4_ = local_1128._0_4_ * fVar42;
                fVar52 = auVar78._4_4_;
                auVar48._4_4_ = local_1128._4_4_ * fVar52;
                fVar12 = auVar78._8_4_;
                auVar48._8_4_ = local_1128._8_4_ * fVar12;
                fVar13 = auVar78._12_4_;
                auVar48._12_4_ = local_1128._12_4_ * fVar13;
                auVar80._8_4_ = 0x3f800000;
                auVar80._0_8_ = 0x3f8000003f800000;
                auVar80._12_4_ = 0x3f800000;
                auVar78 = vsubps_avx(auVar80,auVar48);
                auVar36._0_4_ = fVar42 + fVar42 * auVar78._0_4_;
                auVar36._4_4_ = fVar52 + fVar52 * auVar78._4_4_;
                auVar36._8_4_ = fVar12 + fVar12 * auVar78._8_4_;
                auVar36._12_4_ = fVar13 + fVar13 * auVar78._12_4_;
                auVar49._8_4_ = 0x219392ef;
                auVar49._0_8_ = 0x219392ef219392ef;
                auVar49._12_4_ = 0x219392ef;
                auVar78 = vcmpps_avx(local_ff8,auVar49,5);
                auVar78 = vandps_avx(auVar78,auVar36);
                auVar50._0_4_ = local_fe8._0_4_ * auVar78._0_4_;
                auVar50._4_4_ = local_fe8._4_4_ * auVar78._4_4_;
                auVar50._8_4_ = local_fe8._8_4_ * auVar78._8_4_;
                auVar50._12_4_ = local_fe8._12_4_ * auVar78._12_4_;
                local_10f8 = vminps_avx(auVar50,auVar80);
                auVar37._0_4_ = local_1138._0_4_ * auVar78._0_4_;
                auVar37._4_4_ = local_1138._4_4_ * auVar78._4_4_;
                auVar37._8_4_ = local_1138._8_4_ * auVar78._8_4_;
                auVar37._12_4_ = local_1138._12_4_ * auVar78._12_4_;
                local_10e8 = vminps_avx(auVar37,auVar80);
                auVar38._8_4_ = 0x7f800000;
                auVar38._0_8_ = 0x7f8000007f800000;
                auVar38._12_4_ = 0x7f800000;
                auVar78 = vblendvps_avx(auVar38,local_1248,auVar98);
                auVar79 = vshufps_avx(auVar78,auVar78,0xb1);
                auVar79 = vminps_avx(auVar79,auVar78);
                auVar56 = vshufpd_avx(auVar79,auVar79,1);
                auVar79 = vminps_avx(auVar56,auVar79);
                auVar78 = vcmpps_avx(auVar78,auVar79,0);
                auVar79 = auVar98 & auVar78;
                if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar79[0xf] < '\0') {
                  auVar98 = vandps_avx(auVar78,auVar98);
                }
                uVar26 = vextractps_avx(local_1258,1);
                uVar20 = vmovmskps_avx(auVar98);
                uVar23 = CONCAT44((int)((ulong)&local_1289 >> 0x20),uVar20);
                piVar28 = (int *)0x0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> (long)piVar28 & 1) == 0; piVar28 = (int *)((long)piVar28 + 1)) {
                  }
                }
                do {
                  uVar4 = *(uint *)((long)&local_f88 + (long)piVar28 * 4);
                  pGVar11 = (local_11b0->geometries).items[uVar4].ptr;
                  if ((pGVar11->mask & uVar26) == 0) {
                    *(undefined4 *)(local_1218 + (long)piVar28 * 4) = 0;
                  }
                  else {
                    if (context->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar25 = context->user;
                      if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar42 = *(float *)(local_10f8 + (long)piVar28 * 4);
                        fVar52 = *(float *)(local_10e8 + (long)piVar28 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_10d8 + (long)piVar28 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_10c8 + (long)piVar28 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_10b8 + (long)piVar28 * 4);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_10a8 + (long)piVar28 * 4);
                        ray->u = fVar42;
                        ray->v = fVar52;
                        ray->primID = *(uint *)((long)&local_1158 + (long)piVar28 * 4);
                        ray->geomID = uVar4;
                        ray->instID[0] = pRVar25->instID[0];
                        ray->instPrimID[0] = pRVar25->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar25 = context->user;
                    }
                    local_1278 = (byte *)context->args;
                    local_11a8 = *(undefined4 *)(local_10c8 + (long)piVar28 * 4);
                    local_11a4 = *(undefined4 *)(local_10b8 + (long)piVar28 * 4);
                    local_11a0 = *(undefined4 *)(local_10a8 + (long)piVar28 * 4);
                    local_119c = *(undefined4 *)(local_10f8 + (long)piVar28 * 4);
                    local_1198 = *(undefined4 *)(local_10e8 + (long)piVar28 * 4);
                    local_1194 = *(undefined4 *)((long)&local_1158 + (long)piVar28 * 4);
                    local_1190 = uVar4;
                    local_118c = pRVar25->instID[0];
                    local_1188 = pRVar25->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_10d8 + (long)piVar28 * 4);
                    local_121c = -1;
                    local_11f8.valid = &local_121c;
                    local_11f8.geometryUserPtr = pGVar11->userPtr;
                    local_11f8.context = pRVar25;
                    local_11f8.ray = (RTCRayN *)ray;
                    local_11f8.hit = (RTCHitN *)&local_11a8;
                    local_11f8.N = 1;
                    local_11c8._0_8_ = pGVar11;
                    local_1208._0_8_ = piVar28;
                    if (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011d8346:
                      if ((*(code **)(local_1278 + 0x10) != (code *)0x0) &&
                         (((*local_1278 & 2) != 0 ||
                          ((*(byte *)(local_11c8._0_8_ + 0x3e) & 0x40) != 0)))) {
                        (**(code **)(local_1278 + 0x10))(&local_11f8);
                        piVar28 = (int *)local_1208._0_8_;
                        uVar29 = local_1288;
                        context = local_1228;
                        ray = local_1230;
                        if (*local_11f8.valid == 0) goto LAB_011d8400;
                      }
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11f8.hit;
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11f8.hit + 4);
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11f8.hit + 8);
                      *(float *)((long)local_11f8.ray + 0x3c) = *(float *)(local_11f8.hit + 0xc);
                      *(float *)((long)local_11f8.ray + 0x40) = *(float *)(local_11f8.hit + 0x10);
                      *(float *)((long)local_11f8.ray + 0x44) = *(float *)(local_11f8.hit + 0x14);
                      *(float *)((long)local_11f8.ray + 0x48) = *(float *)(local_11f8.hit + 0x18);
                      *(float *)((long)local_11f8.ray + 0x4c) = *(float *)(local_11f8.hit + 0x1c);
                      *(float *)((long)local_11f8.ray + 0x50) = *(float *)(local_11f8.hit + 0x20);
                    }
                    else {
                      (*pGVar11->intersectionFilterN)(&local_11f8);
                      piVar28 = (int *)local_1208._0_8_;
                      uVar29 = local_1288;
                      context = local_1228;
                      ray = local_1230;
                      if (*local_11f8.valid != 0) goto LAB_011d8346;
LAB_011d8400:
                      (local_1230->super_RayK<1>).tfar = (float)local_1258._0_4_;
                      piVar28 = (int *)local_1208._0_8_;
                      uVar29 = local_1288;
                      context = local_1228;
                      ray = local_1230;
                    }
                    *(undefined4 *)(local_1218 + (long)piVar28 * 4) = 0;
                    fVar42 = (ray->super_RayK<1>).tfar;
                    auVar51._4_4_ = fVar42;
                    auVar51._0_4_ = fVar42;
                    auVar51._8_4_ = fVar42;
                    auVar51._12_4_ = fVar42;
                    auVar78 = vcmpps_avx(local_1248,auVar51,2);
                    local_1218 = vandps_avx(auVar78,local_1218);
                    local_1258._0_4_ = (ray->super_RayK<1>).tfar;
                    local_1258._4_4_ = (ray->super_RayK<1>).mask;
                    local_1258._8_4_ = (ray->super_RayK<1>).id;
                    local_1258._12_4_ = (ray->super_RayK<1>).flags;
                    uVar26 = vextractps_avx(local_1258,1);
                  }
                  if ((((local_1218 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_1218 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_1218 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_1218[0xf]) break;
                  local_1278._0_4_ = uVar26;
                  BVHNIntersector1<4,1,true,embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,true>>>
                  ::intersect(&local_11f8);
                  piVar28 = local_11f8.valid;
                  uVar29 = local_1288;
                  context = local_1228;
                  ray = local_1230;
                  uVar26 = (uint)local_1278;
                } while( true );
              }
            }
            local_1260 = local_1260 + 1;
          } while (local_1260 != local_11b8);
        }
        fVar42 = (ray->super_RayK<1>).tfar;
        auVar39 = ZEXT1664(CONCAT412(fVar42,CONCAT48(fVar42,CONCAT44(fVar42,fVar42))));
        auVar114 = ZEXT1664(local_1018);
        auVar120 = ZEXT1664(local_1028);
        auVar127 = ZEXT1664(local_1038);
        auVar129 = ZEXT1664(local_1048);
        auVar134 = ZEXT1664(local_1058);
        auVar139 = ZEXT1664(local_1068);
        auVar145 = ZEXT1664(local_1078);
        auVar153 = ZEXT1664(local_1088);
        auVar161 = ZEXT1664(local_1098);
        auVar108 = ZEXT1664(local_1178);
        uVar23 = local_1280;
      }
    } while (pauVar21 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }